

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::verifyResourceList
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resourceList,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expectedResources)

{
  int iVar1;
  bool bVar2;
  deBool dVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  size_type sVar6;
  const_reference pvVar7;
  char *pcVar8;
  MessageBuilder local_c70;
  MessageBuilder local_af0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_970;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_968;
  int local_95c;
  undefined1 local_958 [4];
  int ndx_3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7d0;
  int local_7c4;
  undefined1 local_7c0 [4];
  int ndx_2;
  MessageBuilder local_640;
  int local_4bc;
  undefined1 local_4b8 [4];
  int ndx_1;
  MessageBuilder local_338;
  int local_1b8 [2];
  int ndx;
  MessageBuilder local_1a8;
  byte local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool error;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *expectedResources_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resourceList_local;
  ResourceListTestCase *this_local;
  
  local_21 = 0;
  pvStack_20 = expectedResources;
  expectedResources_local = resourceList;
  resourceList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [23])"GL returned resources:");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  for (local_1b8[0] = 0; iVar1 = local_1b8[0],
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(expectedResources_local), iVar1 < (int)sVar6; local_1b8[0] = local_1b8[0] + 1)
  {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](expectedResources_local,(long)local_1b8[0]);
    pcVar8 = getDummyZeroUniformName();
    bVar2 = std::operator!=(pvVar7,pcVar8);
    if (bVar2) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_338,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [2])0x2b88b2a);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1b8);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a0a8b4);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](expectedResources_local,(long)local_1b8[0]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar7);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_338);
    }
  }
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_4b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_4b8,(char (*) [28])"Expected list of resources:");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4b8);
  for (local_4bc = 0; iVar1 = local_4bc,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvStack_20), iVar1 < (int)sVar6; local_4bc = local_4bc + 1) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_640,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_640,(char (*) [2])0x2b88b2a);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_4bc);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a0a8b4);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,(long)local_4bc);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar7);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_640);
  }
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_7c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_7c0,(char (*) [34])"Verifying resource list contents."
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_7c0);
  for (local_7c4 = 0; iVar1 = local_7c4,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvStack_20), iVar1 < (int)sVar6; local_7c4 = local_7c4 + 1) {
    local_7d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(expectedResources_local);
    local_7d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(expectedResources_local);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,(long)local_7c4);
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                      (&local_7d0,&local_7d8,pvVar7);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_958,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_958,
                          (char (*) [54])"Error, resource list did not contain active resource ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_20,(long)local_7c4);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar7);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_958);
      local_21 = 1;
    }
  }
  local_95c = 0;
  do {
    iVar1 = local_95c;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(expectedResources_local);
    if ((int)sVar6 <= iVar1) {
      return (bool)((local_21 ^ 0xff) & 1);
    }
    local_968._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(pvStack_20);
    local_970._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvStack_20);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](expectedResources_local,(long)local_95c);
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                      (&local_968,&local_970,pvVar7);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](expectedResources_local,(long)local_95c);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      dVar3 = deStringBeginsWith(pcVar8,"gl_");
      if (dVar3 == 0) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](expectedResources_local,(long)local_95c);
        pcVar8 = getDummyZeroUniformName();
        bVar2 = std::operator!=(pvVar7,pcVar8);
        if (bVar2) {
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_af0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_af0,
                              (char (*) [56])
                              "Error, resource list contains unexpected resource name ");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](expectedResources_local,(long)local_95c);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar7);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_af0);
          local_21 = 1;
          goto LAB_02236e77;
        }
      }
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_c70,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_c70,(char (*) [47])"Note, resource list contains unknown built-in "
                         );
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](expectedResources_local,(long)local_95c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar7);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [28])". This variable is ignored.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c70);
    }
LAB_02236e77:
    local_95c = local_95c + 1;
  } while( true );
}

Assistant:

bool ResourceListTestCase::verifyResourceList (const std::vector<std::string>& resourceList, const std::vector<std::string>& expectedResources)
{
	bool error = false;

	// Log and compare resource lists

	m_testCtx.getLog() << tcu::TestLog::Message << "GL returned resources:" << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)resourceList.size(); ++ndx)
	{
		// dummyZero is a uniform that may be added by
		// generateProgramInterfaceProgramSources.  Omit it here to avoid
		// confusion about the output.
		if (resourceList[ndx] != getDummyZeroUniformName())
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << ndx << ": " << resourceList[ndx] << tcu::TestLog::EndMessage;
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Expected list of resources:" << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)expectedResources.size(); ++ndx)
		m_testCtx.getLog() << tcu::TestLog::Message << "\t" << ndx << ": " << expectedResources[ndx] << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying resource list contents." << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)expectedResources.size(); ++ndx)
	{
		if (!de::contains(resourceList.begin(), resourceList.end(), expectedResources[ndx]))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, resource list did not contain active resource " << expectedResources[ndx] << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	for (int ndx = 0; ndx < (int)resourceList.size(); ++ndx)
	{
		if (!de::contains(expectedResources.begin(), expectedResources.end(), resourceList[ndx]))
		{
			// Ignore all builtin variables or the variable dummyZero,
			// mismatch causes errors otherwise.  dummyZero is a uniform that
			// may be added by generateProgramInterfaceProgramSources.
			if (deStringBeginsWith(resourceList[ndx].c_str(), "gl_") == DE_FALSE &&
				resourceList[ndx] != getDummyZeroUniformName())
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, resource list contains unexpected resource name " << resourceList[ndx] << tcu::TestLog::EndMessage;
				error = true;
			}
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Note, resource list contains unknown built-in " << resourceList[ndx] << ". This variable is ignored." << tcu::TestLog::EndMessage;
		}
	}

	return !error;
}